

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<tonk::gateway::SSDPRequester,_std::default_delete<tonk::gateway::SSDPRequester>_>
tonk::MakeUniqueNoThrow<tonk::gateway::SSDPRequester>(void)

{
  SSDPRequester *this;
  __uniq_ptr_data<tonk::gateway::SSDPRequester,_std::default_delete<tonk::gateway::SSDPRequester>,_true,_true>
  in_RDI;
  
  this = (SSDPRequester *)operator_new(0x5f0,(nothrow_t *)&std::nothrow);
  if (this != (SSDPRequester *)0x0) {
    memset(this,0,0x5f0);
    gateway::SSDPRequester::SSDPRequester(this);
  }
  *(SSDPRequester **)
   in_RDI.
   super___uniq_ptr_impl<tonk::gateway::SSDPRequester,_std::default_delete<tonk::gateway::SSDPRequester>_>
   ._M_t.
   super__Tuple_impl<0UL,_tonk::gateway::SSDPRequester_*,_std::default_delete<tonk::gateway::SSDPRequester>_>
   .super__Head_base<0UL,_tonk::gateway::SSDPRequester_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<tonk::gateway::SSDPRequester,_std::default_delete<tonk::gateway::SSDPRequester>,_true,_true>
          )(tuple<tonk::gateway::SSDPRequester_*,_std::default_delete<tonk::gateway::SSDPRequester>_>
            )in_RDI.
             super___uniq_ptr_impl<tonk::gateway::SSDPRequester,_std::default_delete<tonk::gateway::SSDPRequester>_>
             ._M_t.
             super__Tuple_impl<0UL,_tonk::gateway::SSDPRequester_*,_std::default_delete<tonk::gateway::SSDPRequester>_>
             .super__Head_base<0UL,_tonk::gateway::SSDPRequester_*,_false>._M_head_impl;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}